

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::CollapseFullPath
                   (string *__return_storage_ptr__,string *in_path,char *in_base)

{
  char *pcVar1;
  char buf [2048];
  allocator<char> local_839;
  string local_838;
  char local_818 [2048];
  
  if (in_base == (char *)0x0) {
    pcVar1 = getcwd(local_818,0x800);
    in_base = "";
    if (pcVar1 != (char *)0x0) {
      in_base = pcVar1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,in_base,&local_839);
  CollapseFullPath(__return_storage_ptr__,in_path,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CollapseFullPath(const std::string& in_path,
                                          const char* in_base)
{
  // Use the current working directory as a base path.
  char buf[2048];
  const char* res_in_base = in_base;
  if (!res_in_base) {
    if (const char* cwd = Getcwd(buf, 2048)) {
      res_in_base = cwd;
    } else {
      res_in_base = "";
    }
  }

  return SystemTools::CollapseFullPath(in_path, std::string(res_in_base));
}